

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

void llvm::cl::
     apply<llvm::cl::opt<bool,false,llvm::cl::parser<bool>>,char[18],llvm::cl::desc,llvm::cl::OptionHidden,llvm::cl::initializer<bool>,llvm::cl::cat,llvm::cl::sub>
               (opt<bool,_false,_llvm::cl::parser<bool>_> *O,char (*M) [18],desc *Ms,
               OptionHidden *Ms_1,initializer<bool> *Ms_2,cat *Ms_3,sub *Ms_4)

{
  size_t sVar1;
  StringRef S;
  
  sVar1 = strlen(*M);
  S.Length = sVar1;
  S.Data = *M;
  Option::setArgStr(&O->super_Option,S);
  apply<llvm::cl::opt<bool,false,llvm::cl::parser<bool>>,llvm::cl::desc,llvm::cl::OptionHidden,llvm::cl::initializer<bool>,llvm::cl::cat,llvm::cl::sub>
            (O,Ms,Ms_1,Ms_2,Ms_3,Ms_4);
  return;
}

Assistant:

void apply(Opt *O, const Mod &M, const Mods &... Ms) {
  applicator<Mod>::opt(M, *O);
  apply(O, Ms...);
}